

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

void __thiscall rapidjson::internal::BigInteger::PushBack(BigInteger *this,Type digit)

{
  size_t sVar1;
  RapidJSONException *this_00;
  Type digit_local;
  BigInteger *this_local;
  
  if (0x19f < this->count_) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: count_ < kCapacity");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  sVar1 = this->count_;
  this->count_ = sVar1 + 1;
  this->digits_[sVar1] = digit;
  return;
}

Assistant:

void PushBack(Type digit) {
        CEREAL_RAPIDJSON_ASSERT(count_ < kCapacity);
        digits_[count_++] = digit;
    }